

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::Psbt::GetDataSize(Psbt *this)

{
  wally_psbt *psbt;
  size_t sVar1;
  undefined8 uVar2;
  string *in_stack_ffffffffffffff60;
  ByteData *__return_storage_ptr__;
  undefined8 in_stack_ffffffffffffff68;
  CfdError error_code;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 uVar3;
  allocator in_stack_ffffffffffffff77;
  string local_88 [32];
  CfdSourceLocation local_68;
  int local_50 [2];
  int ret;
  undefined1 local_40 [8];
  ByteData data;
  size_t size;
  wally_psbt *psbt_pointer;
  Psbt *this_local;
  
  error_code = (CfdError)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  psbt = (wally_psbt *)this->wally_psbt_pointer_;
  data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((psbt == (wally_psbt *)0x0) || (psbt->num_inputs != 0)) {
    local_50[0] = wally_psbt_get_length
                            (psbt,0,(size_t *)
                                    &data.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_50[0] != 0) {
      local_68.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_68.filename = local_68.filename + 1;
      local_68.line = 0x7f6;
      local_68.funcname = "GetDataSize";
      logger::warn<int&>(&local_68,"wally_psbt_get_length NG[{}]",local_50);
      uVar3 = 1;
      uVar2 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_88,"psbt get length error.",(allocator *)&stack0xffffffffffffff77);
      CfdException::CfdException
                ((CfdException *)
                 CONCAT17(in_stack_ffffffffffffff77,CONCAT16(uVar3,in_stack_ffffffffffffff70)),
                 error_code,in_stack_ffffffffffffff60);
      __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    this_local._4_4_ =
         (uint32_t)
         data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    __return_storage_ptr__ = (ByteData *)local_40;
    CreatePsbtOutputOnlyData(__return_storage_ptr__,psbt);
    sVar1 = ByteData::GetDataSize(__return_storage_ptr__);
    this_local._4_4_ = (uint32_t)sVar1;
    ByteData::~ByteData((ByteData *)0x46f051);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t Psbt::GetDataSize() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  size_t size = 0;

  if ((psbt_pointer != nullptr) && (psbt_pointer->num_inputs == 0)) {
    auto data = CreatePsbtOutputOnlyData(psbt_pointer);
    return static_cast<uint32_t>(data.GetDataSize());
  }

  int ret = wally_psbt_get_length(psbt_pointer, 0, &size);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_get_length NG[{}]", ret);
    throw CfdException(kCfdIllegalStateError, "psbt get length error.");
  }
  return static_cast<uint32_t>(size);
}